

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall crypto_tests::poly1305_testvector::test_method(poly1305_testvector *this)

{
  long lVar1;
  iterator in_R8;
  iterator in_R9;
  uint i;
  size_type __n;
  long in_FS_OFFSET;
  Span<const_std::byte> key_00;
  Span<const_std::byte> key_01;
  Span<std::byte> out;
  Span<std::byte> out_00;
  const_string file;
  Span<const_unsigned_char> s;
  const_string msg;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  vector<std::byte,_std::allocator<std::byte>_> total_tag;
  vector<std::byte,_std::allocator<std::byte>_> key;
  undefined1 local_118 [88];
  array<std::byte,_16UL> tag;
  Poly1305 total_ctx;
  array<std::byte,_32UL> total_key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_ctx,
             "43727970746f6772617068696320466f72756d2052657365617263682047726f7570",
             (allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"85d6be7857556d337f4452fe42d506a80103808afb0db2fd4abff6af4149f51b",
             (allocator<char> *)&total_tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_key,"a8061dc1305136c6c22b8baf0c0127a9",(allocator<char> *)&tag);
  CryptoTest::TestPoly1305
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&total_ctx,(string *)local_118,
             (string *)&total_key);
  std::__cxx11::string::~string((string *)&total_key);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)&total_ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_ctx,
             "00000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"0000000000000000000000000000000000000000000000000000000000000000",
             (allocator<char> *)&total_tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_key,"00000000000000000000000000000000",(allocator<char> *)&tag);
  CryptoTest::TestPoly1305
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&total_ctx,(string *)local_118,
             (string *)&total_key);
  std::__cxx11::string::~string((string *)&total_key);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)&total_ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_ctx,
             "416e79207375626d697373696f6e20746f20746865204945544620696e74656e6465642062792074686520436f6e7472696275746f7220666f72207075626c69636174696f6e20617320616c6c206f722070617274206f6620616e204945544620496e7465726e65742d4472616674206f722052464320616e6420616e792073746174656d656e74206d6164652077697468696e2074686520636f6e74657874206f6620616e204945544620616374697669747920697320636f6e7369646572656420616e20224945544620436f6e747269627574696f6e222e20537563682073746174656d656e747320696e636c756465206f72616c2073746174656d656e747320696e20494554462073657373696f6e732c2061732077656c6c206173207772697474656e20616e6420656c656374726f6e696320636f6d6d756e69636174696f6e73206d61646520617420616e792074696d65206f7220706c6163652c207768696368206172652061646472657373656420746f"
             ,(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"0000000000000000000000000000000036e5f6b5c5e06070f0efca96227a863e",
             (allocator<char> *)&total_tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_key,"36e5f6b5c5e06070f0efca96227a863e",(allocator<char> *)&tag);
  CryptoTest::TestPoly1305
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&total_ctx,(string *)local_118,
             (string *)&total_key);
  std::__cxx11::string::~string((string *)&total_key);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)&total_ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_ctx,
             "416e79207375626d697373696f6e20746f20746865204945544620696e74656e6465642062792074686520436f6e7472696275746f7220666f72207075626c69636174696f6e20617320616c6c206f722070617274206f6620616e204945544620496e7465726e65742d4472616674206f722052464320616e6420616e792073746174656d656e74206d6164652077697468696e2074686520636f6e74657874206f6620616e204945544620616374697669747920697320636f6e7369646572656420616e20224945544620436f6e747269627574696f6e222e20537563682073746174656d656e747320696e636c756465206f72616c2073746174656d656e747320696e20494554462073657373696f6e732c2061732077656c6c206173207772697474656e20616e6420656c656374726f6e696320636f6d6d756e69636174696f6e73206d61646520617420616e792074696d65206f7220706c6163652c207768696368206172652061646472657373656420746f"
             ,(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"36e5f6b5c5e06070f0efca96227a863e00000000000000000000000000000000",
             (allocator<char> *)&total_tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_key,"f3477e7cd95417af89a6b8794c310cf0",(allocator<char> *)&tag);
  CryptoTest::TestPoly1305
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&total_ctx,(string *)local_118,
             (string *)&total_key);
  std::__cxx11::string::~string((string *)&total_key);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)&total_ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_ctx,
             "2754776173206272696c6c69672c20616e642074686520736c6974687920746f7665730a446964206779726520616e642067696d626c6520696e2074686520776162653a0a416c6c206d696d737920776572652074686520626f726f676f7665732c0a416e6420746865206d6f6d65207261746873206f757467726162652e"
             ,(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"1c9240a5eb55d38af333888604f6b5f0473917c1402b80099dca5cbc207075c0",
             (allocator<char> *)&total_tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_key,"4541669a7eaaee61e708dc7cbcc5eb62",(allocator<char> *)&tag);
  CryptoTest::TestPoly1305
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&total_ctx,(string *)local_118,
             (string *)&total_key);
  std::__cxx11::string::~string((string *)&total_key);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)&total_ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_ctx,"ffffffffffffffffffffffffffffffff",(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"0200000000000000000000000000000000000000000000000000000000000000",
             (allocator<char> *)&total_tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_key,"03000000000000000000000000000000",(allocator<char> *)&tag);
  CryptoTest::TestPoly1305
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&total_ctx,(string *)local_118,
             (string *)&total_key);
  std::__cxx11::string::~string((string *)&total_key);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)&total_ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_ctx,"02000000000000000000000000000000",(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"02000000000000000000000000000000ffffffffffffffffffffffffffffffff",
             (allocator<char> *)&total_tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_key,"03000000000000000000000000000000",(allocator<char> *)&tag);
  CryptoTest::TestPoly1305
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&total_ctx,(string *)local_118,
             (string *)&total_key);
  std::__cxx11::string::~string((string *)&total_key);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)&total_ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_ctx,
             "fffffffffffffffffffffffffffffffff0ffffffffffffffffffffffffffffff11000000000000000000000000000000"
             ,(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"0100000000000000000000000000000000000000000000000000000000000000",
             (allocator<char> *)&total_tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_key,"05000000000000000000000000000000",(allocator<char> *)&tag);
  CryptoTest::TestPoly1305
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&total_ctx,(string *)local_118,
             (string *)&total_key);
  std::__cxx11::string::~string((string *)&total_key);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)&total_ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_ctx,
             "fffffffffffffffffffffffffffffffffbfefefefefefefefefefefefefefefe01010101010101010101010101010101"
             ,(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"0100000000000000000000000000000000000000000000000000000000000000",
             (allocator<char> *)&total_tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_key,"00000000000000000000000000000000",(allocator<char> *)&tag);
  CryptoTest::TestPoly1305
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&total_ctx,(string *)local_118,
             (string *)&total_key);
  std::__cxx11::string::~string((string *)&total_key);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)&total_ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_ctx,"fdffffffffffffffffffffffffffffff",(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"0200000000000000000000000000000000000000000000000000000000000000",
             (allocator<char> *)&total_tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_key,"faffffffffffffffffffffffffffffff",(allocator<char> *)&tag);
  CryptoTest::TestPoly1305
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&total_ctx,(string *)local_118,
             (string *)&total_key);
  std::__cxx11::string::~string((string *)&total_key);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)&total_ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_ctx,
             "e33594d7505e43b900000000000000003394d7505e4379cd01000000000000000000000000000000000000000000000001000000000000000000000000000000"
             ,(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"0100000000000000040000000000000000000000000000000000000000000000",
             (allocator<char> *)&total_tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_key,"14000000000000005500000000000000",(allocator<char> *)&tag);
  CryptoTest::TestPoly1305
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&total_ctx,(string *)local_118,
             (string *)&total_key);
  std::__cxx11::string::~string((string *)&total_key);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)&total_ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_ctx,
             "e33594d7505e43b900000000000000003394d7505e4379cd010000000000000000000000000000000000000000000000"
             ,(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"0100000000000000040000000000000000000000000000000000000000000000",
             (allocator<char> *)&total_tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_key,"13000000000000000000000000000000",(allocator<char> *)&tag);
  CryptoTest::TestPoly1305
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&total_ctx,(string *)local_118,
             (string *)&total_key);
  std::__cxx11::string::~string((string *)&total_key);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)&total_ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_ctx,
             "8e993b9f48681273c29650ba32fc76ce48332ea7164d96a4476fb8c531a1186ac0dfc17c98dce87b4da7f011ec48c97271d2c20f9b928fe2270d6fb863d51738b48eeee314a7cc8ab932164548e526ae90224368517acfeabd6bb3732bc0e9da99832b61ca01b6de56244a9e88d5f9b37973f622a43d14a6599b1f654cb45a74e355a5"
             ,(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"eea6a7251c1e72916d11c2cb214d3c252539121d8e234e652d651fa4c8cff880",
             (allocator<char> *)&total_tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_key,"f3ffc7703f9400e52a7dfb4b3d3305d9",(allocator<char> *)&tag);
  CryptoTest::TestPoly1305
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&total_ctx,(string *)local_118,
             (string *)&total_key);
  std::__cxx11::string::~string((string *)&total_key);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)&total_ctx);
  total_key._M_elems[0x10] = 0xff;
  total_key._M_elems[0x11] = 0xff;
  total_key._M_elems[0x12] = 0xff;
  total_key._M_elems[0x13] = 0xff;
  total_key._M_elems[0x14] = 0xff;
  total_key._M_elems[0x15] = 0xff;
  total_key._M_elems[0x16] = 0xff;
  total_key._M_elems[0x17] = 0xff;
  total_key._M_elems[0x18] = 0xff;
  total_key._M_elems[0x19] = 0xff;
  total_key._M_elems[0x1a] = 0xff;
  total_key._M_elems[0x1b] = 0xff;
  total_key._M_elems[0x1c] = 0;
  total_key._M_elems[0x1d] = 0;
  total_key._M_elems[0x1e] = 0;
  total_key._M_elems[0x1f] = 0;
  total_key._M_elems[0] = 1;
  total_key._M_elems[1] = 2;
  total_key._M_elems[2] = 3;
  total_key._M_elems[3] = 4;
  total_key._M_elems[4] = 5;
  total_key._M_elems[5] = 6;
  total_key._M_elems[6] = 7;
  total_key._M_elems[7] = 0xff;
  total_key._M_elems[8] = 0xfe;
  total_key._M_elems[9] = 0xfd;
  total_key._M_elems[10] = 0xfc;
  total_key._M_elems[0xb] = 0xfb;
  total_key._M_elems[0xc] = 0xfa;
  total_key._M_elems[0xd] = 0xf9;
  total_key._M_elems[0xe] = 0xff;
  total_key._M_elems[0xf] = 0xff;
  key_00.m_size = 0x20;
  key_00.m_data = total_key._M_elems;
  Poly1305::Poly1305(&total_ctx,key_00);
  for (__n = 0; __n != 0x100; __n = __n + 1) {
    local_118[0] = SUB81(__n,0);
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)
               &key.super__Vector_base<std::byte,_std::allocator<std::byte>_>,0x20,
               (value_type *)local_118,(allocator_type *)&total_tag);
    local_118[0] = SUB81(__n,0);
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              (&total_tag,__n,(value_type *)local_118,(allocator_type *)&tag);
    key_01.m_size =
         (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    key_01.m_data =
         key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    Poly1305::Poly1305((Poly1305 *)local_118,key_01);
    poly1305_donna::poly1305_update
              ((poly1305_context *)local_118,
               total_tag.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)total_tag.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)total_tag.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start);
    out.m_size = 0x10;
    out.m_data = (byte *)&tag;
    Poly1305::Finalize((Poly1305 *)local_118,out);
    poly1305_donna::poly1305_update(&total_ctx.m_ctx,(uchar *)&tag,0x10);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&total_tag);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              (&key.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  }
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (&total_tag,0x10,(allocator_type *)local_118);
  out_00.m_size =
       (long)total_tag.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)total_tag.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  out_00.m_data =
       total_tag.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  Poly1305::Finalize(&total_ctx,out_00);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x3ae;
  file.m_begin = (iterator)&local_160;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_170,msg);
  local_118[8] = 0;
  local_118._0_8_ = &PTR__lazy_ostream_011480b0;
  local_118._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_118._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_178 = "";
  s.m_size = (long)total_tag.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)total_tag.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
  s.m_data = total_tag.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_((string *)&key,s);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[33]>
            (local_118,&local_180,0x3ae,1,2,&key,"HexStr(total_tag)",
             "64afe2e8d6ad7bbdd287f97c44623d39","\"64afe2e8d6ad7bbdd287f97c44623d39\"");
  std::__cxx11::string::~string((string *)&key);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&total_tag.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_ctx,
             "000000000000000000000094000000000000b07c4300000000002c002600d50000000000000000000000000000bc58000000000000000000c9000000dd00000000000000000000d34c000000000000000000000000f9009100000000000000c24b0000e900000000000000000000000000000000000e000000270000740000000000000003000000000000f1000000000000dce20000000000000039000000000000000000000000000000000000000000000000000000520000000000000000000000000000000000000000009500000000000000000000000000cf00826700000000a9000000000000000000000000000000000000000000790000000000000000de0000004c000000000033000000000000000000000000002800aa00000000003300860000e000000000"
             ,(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"6e543496db3cf677592989891ab021f58390feb84fb419fbc7bb516a60bfa302",
             (allocator<char> *)&total_tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_key,"7ea80968354d40d9d790b45310caf7f3",(allocator<char> *)&tag);
  CryptoTest::TestPoly1305
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&total_ctx,(string *)local_118,
             (string *)&total_key);
  std::__cxx11::string::~string((string *)&total_key);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)&total_ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_ctx,
             "0000005900000000c40000002f000000000000000000000000000000296900000000e8000037000000000000000000000000000b000000000000000000000000000000000000000000000000001800006e0000000000a400000000000000000000000000000000004d00000000000000b0000000000000000000005a000000000000000000b7c300000000000000540000000000000000000000000a0000000000005b0000000000000000000000000000000000002d00e70000000000000000000000000000003400006800d70000000000000000000036000000000000000000eb00000000000000000000000000000000000000000000000000002800000037000000000000000000000000000000000000000000000000000000008f0000000000000000000000000000"
             ,(allocator<char> *)&key);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"f0b659a4f3143d8a1e1dacb9a409fe7e7cd501dfb58b16a2623046c5d337922a",
             (allocator<char> *)&total_tag);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&total_key,"0e410fa9d7a40ac582e77546be9a72bb",(allocator<char> *)&tag);
  CryptoTest::TestPoly1305
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(string *)&total_ctx,(string *)local_118,
             (string *)&total_key);
  std::__cxx11::string::~string((string *)&total_key);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)&total_ctx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(poly1305_testvector)
{
    // RFC 7539, section 2.5.2.
    TestPoly1305("43727970746f6772617068696320466f72756d2052657365617263682047726f7570",
                 "85d6be7857556d337f4452fe42d506a80103808afb0db2fd4abff6af4149f51b",
                 "a8061dc1305136c6c22b8baf0c0127a9");

    // RFC 7539, section A.3.
    TestPoly1305("00000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
                 "000000000000000000000000000",
                 "0000000000000000000000000000000000000000000000000000000000000000",
                 "00000000000000000000000000000000");

    TestPoly1305("416e79207375626d697373696f6e20746f20746865204945544620696e74656e6465642062792074686520436f6e747269627"
                 "5746f7220666f72207075626c69636174696f6e20617320616c6c206f722070617274206f6620616e204945544620496e7465"
                 "726e65742d4472616674206f722052464320616e6420616e792073746174656d656e74206d6164652077697468696e2074686"
                 "520636f6e74657874206f6620616e204945544620616374697669747920697320636f6e7369646572656420616e2022494554"
                 "4620436f6e747269627574696f6e222e20537563682073746174656d656e747320696e636c756465206f72616c20737461746"
                 "56d656e747320696e20494554462073657373696f6e732c2061732077656c6c206173207772697474656e20616e6420656c65"
                 "6374726f6e696320636f6d6d756e69636174696f6e73206d61646520617420616e792074696d65206f7220706c6163652c207"
                 "768696368206172652061646472657373656420746f",
                 "0000000000000000000000000000000036e5f6b5c5e06070f0efca96227a863e",
                 "36e5f6b5c5e06070f0efca96227a863e");

    TestPoly1305("416e79207375626d697373696f6e20746f20746865204945544620696e74656e6465642062792074686520436f6e747269627"
                 "5746f7220666f72207075626c69636174696f6e20617320616c6c206f722070617274206f6620616e204945544620496e7465"
                 "726e65742d4472616674206f722052464320616e6420616e792073746174656d656e74206d6164652077697468696e2074686"
                 "520636f6e74657874206f6620616e204945544620616374697669747920697320636f6e7369646572656420616e2022494554"
                 "4620436f6e747269627574696f6e222e20537563682073746174656d656e747320696e636c756465206f72616c20737461746"
                 "56d656e747320696e20494554462073657373696f6e732c2061732077656c6c206173207772697474656e20616e6420656c65"
                 "6374726f6e696320636f6d6d756e69636174696f6e73206d61646520617420616e792074696d65206f7220706c6163652c207"
                 "768696368206172652061646472657373656420746f",
                 "36e5f6b5c5e06070f0efca96227a863e00000000000000000000000000000000",
                 "f3477e7cd95417af89a6b8794c310cf0");

    TestPoly1305("2754776173206272696c6c69672c20616e642074686520736c6974687920746f7665730a446964206779726520616e6420676"
                 "96d626c6520696e2074686520776162653a0a416c6c206d696d737920776572652074686520626f726f676f7665732c0a416e"
                 "6420746865206d6f6d65207261746873206f757467726162652e",
                 "1c9240a5eb55d38af333888604f6b5f0473917c1402b80099dca5cbc207075c0",
                 "4541669a7eaaee61e708dc7cbcc5eb62");

    TestPoly1305("ffffffffffffffffffffffffffffffff",
                 "0200000000000000000000000000000000000000000000000000000000000000",
                 "03000000000000000000000000000000");

    TestPoly1305("02000000000000000000000000000000",
                 "02000000000000000000000000000000ffffffffffffffffffffffffffffffff",
                 "03000000000000000000000000000000");

    TestPoly1305("fffffffffffffffffffffffffffffffff0ffffffffffffffffffffffffffffff11000000000000000000000000000000",
                 "0100000000000000000000000000000000000000000000000000000000000000",
                 "05000000000000000000000000000000");

    TestPoly1305("fffffffffffffffffffffffffffffffffbfefefefefefefefefefefefefefefe01010101010101010101010101010101",
                 "0100000000000000000000000000000000000000000000000000000000000000",
                 "00000000000000000000000000000000");

    TestPoly1305("fdffffffffffffffffffffffffffffff",
                 "0200000000000000000000000000000000000000000000000000000000000000",
                 "faffffffffffffffffffffffffffffff");

    TestPoly1305("e33594d7505e43b900000000000000003394d7505e4379cd01000000000000000000000000000000000000000000000001000000000000000000000000000000",
                 "0100000000000000040000000000000000000000000000000000000000000000",
                 "14000000000000005500000000000000");

    TestPoly1305("e33594d7505e43b900000000000000003394d7505e4379cd010000000000000000000000000000000000000000000000",
                 "0100000000000000040000000000000000000000000000000000000000000000",
                 "13000000000000000000000000000000");

    // Tests from https://github.com/floodyberry/poly1305-donna/blob/master/poly1305-donna.c
    TestPoly1305("8e993b9f48681273c29650ba32fc76ce48332ea7164d96a4476fb8c531a1186a"
                 "c0dfc17c98dce87b4da7f011ec48c97271d2c20f9b928fe2270d6fb863d51738"
                 "b48eeee314a7cc8ab932164548e526ae90224368517acfeabd6bb3732bc0e9da"
                 "99832b61ca01b6de56244a9e88d5f9b37973f622a43d14a6599b1f654cb45a74"
                 "e355a5",
                 "eea6a7251c1e72916d11c2cb214d3c252539121d8e234e652d651fa4c8cff880",
                 "f3ffc7703f9400e52a7dfb4b3d3305d9");
    {
        // mac of the macs of messages of length 0 to 256, where the key and messages have all
        // their values set to the length.
        auto total_key = "01020304050607fffefdfcfbfaf9ffffffffffffffffffffffffffff00000000"_hex;
        Poly1305 total_ctx(total_key);
        for (unsigned i = 0; i < 256; ++i) {
            std::vector<std::byte> key(32, std::byte{uint8_t(i)});
            std::vector<std::byte> msg(i, std::byte{uint8_t(i)});
            std::array<std::byte, Poly1305::TAGLEN> tag;
            Poly1305{key}.Update(msg).Finalize(tag);
            total_ctx.Update(tag);
        }
        std::vector<std::byte> total_tag(Poly1305::TAGLEN);
        total_ctx.Finalize(total_tag);
        BOOST_CHECK_EQUAL(HexStr(total_tag), "64afe2e8d6ad7bbdd287f97c44623d39");
    }

    // Tests with sparse messages and random keys.
    TestPoly1305("000000000000000000000094000000000000b07c4300000000002c002600d500"
                 "00000000000000000000000000bc58000000000000000000c9000000dd000000"
                 "00000000000000d34c000000000000000000000000f9009100000000000000c2"
                 "4b0000e900000000000000000000000000000000000e00000027000074000000"
                 "0000000003000000000000f1000000000000dce2000000000000003900000000"
                 "0000000000000000000000000000000000000000000000520000000000000000"
                 "000000000000000000000000009500000000000000000000000000cf00826700"
                 "000000a900000000000000000000000000000000000000000079000000000000"
                 "0000de0000004c000000000033000000000000000000000000002800aa000000"
                 "00003300860000e000000000",
                 "6e543496db3cf677592989891ab021f58390feb84fb419fbc7bb516a60bfa302",
                 "7ea80968354d40d9d790b45310caf7f3");
    TestPoly1305("0000005900000000c40000002f00000000000000000000000000000029690000"
                 "0000e8000037000000000000000000000000000b000000000000000000000000"
                 "000000000000000000000000001800006e0000000000a4000000000000000000"
                 "00000000000000004d00000000000000b0000000000000000000005a00000000"
                 "0000000000b7c300000000000000540000000000000000000000000a00000000"
                 "00005b0000000000000000000000000000000000002d00e70000000000000000"
                 "000000000000003400006800d700000000000000000000360000000000000000"
                 "00eb000000000000000000000000000000000000000000000000000028000000"
                 "37000000000000000000000000000000000000000000000000000000008f0000"
                 "000000000000000000000000",
                 "f0b659a4f3143d8a1e1dacb9a409fe7e7cd501dfb58b16a2623046c5d337922a",
                 "0e410fa9d7a40ac582e77546be9a72bb");
}